

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O1

address __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::iterator_base<true>::get_address(iterator_base<true> *this)

{
  const_reference pvVar1;
  
  if ((this->visited_parents_).elements_ == 0) {
    assert_failed("visited_parents_.size () >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                  ,0xba);
  }
  pvVar1 = array_stack<pstore::index::details::parent_type,_13UL>::top(&this->visited_parents_);
  if ((((ulong)(pvVar1->node).internal_ & 1) == 0) && (pvVar1->position == 0xffffffffffffffff)) {
    if (((ulong)(pvVar1->node).internal_ & 2) == 0) {
      return (address)(value_type)(pvVar1->node).internal_;
    }
    __assert_fail("is_address ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                  ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
  }
  assert_failed("parent.node.is_leaf () && parent.position == details::not_found",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                ,0xbc);
}

Assistant:

address get_address () const {
                    PSTORE_ASSERT (visited_parents_.size () >= 1);
                    details::parent_type const & parent = visited_parents_.top ();
                    PSTORE_ASSERT (parent.node.is_leaf () && parent.position == details::not_found);
                    return parent.node.to_address ();
                }